

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

int __thiscall
DnsStats::SubmitRecord
          (DnsStats *this,uint8_t *packet,uint32_t length,uint32_t start,uint32_t *e_rcode,
          uint32_t *e_length,bool is_response)

{
  uint uVar1;
  uint ldata_00;
  int name_start;
  int ldata;
  uint ttl;
  int rrclass;
  int rrtype;
  bool is_response_local;
  uint32_t *e_length_local;
  uint32_t *e_rcode_local;
  uint32_t start_local;
  uint32_t length_local;
  uint8_t *packet_local;
  DnsStats *this_local;
  
  this->record_count = this->record_count + 1;
  uVar1 = SubmitName(this,packet,length,start,is_response);
  e_rcode_local._0_4_ = length;
  if (length < uVar1 + 10) {
    this->error_flags = this->error_flags | 0x100;
  }
  else {
    ldata_00 = (uint)CONCAT11(packet[uVar1 + 8],packet[uVar1 + 9]);
    if (length < uVar1 + ldata_00 + 10) {
      this->error_flags = this->error_flags | 0x100;
    }
    else {
      SubmitRecordContent(this,(uint)CONCAT11(packet[uVar1],packet[uVar1 + 1]),
                          (uint)CONCAT11(packet[uVar1 + 2],packet[uVar1 + 3]),
                          (uint)packet[uVar1 + 4] << 0x18 | (uint)packet[uVar1 + 5] << 0x10 |
                          (uint)packet[uVar1 + 6] << 8 | (uint)packet[uVar1 + 7],ldata_00,
                          packet + (ulong)uVar1 + 10,packet,length,start,e_rcode,e_length,
                          is_response);
      e_rcode_local._0_4_ = ldata_00 + 10 + uVar1;
    }
  }
  return (uint32_t)e_rcode_local;
}

Assistant:

int DnsStats::SubmitRecord(uint8_t* packet, uint32_t length, uint32_t start,
    uint32_t* e_rcode, uint32_t* e_length, bool is_response)
{
    int rrtype = 0;
    int rrclass = 0;
    unsigned int ttl = 0;
    int ldata = 0;
    int name_start = start;

    record_count++;

    /* Labels are only tabulated in responses, to avoid polluting data with erroneous packets */
    start = SubmitName(packet, length, start, is_response);

    if ((start + 10) > length)
    {
        error_flags |= DNS_REGISTRY_ERROR_FORMAT;
        start = length;
    }
    else
    {
        rrtype = (packet[start] << 8) | packet[start + 1];
        rrclass = (packet[start + 2] << 8) | packet[start + 3];
        ttl = (packet[start + 4] << 24) | (packet[start + 5] << 16)
            | (packet[start + 6] << 8) | packet[start + 7];
        ldata = (packet[start + 8] << 8) | packet[start + 9];

        if (start + ldata + 10 > length)
        {
            error_flags |= DNS_REGISTRY_ERROR_FORMAT;
            start = length;
        }
        else
        {
            SubmitRecordContent(rrtype, rrclass, ttl, ldata, packet + start + 10,
                packet, length, name_start, e_rcode, e_length, is_response);
            start += ldata + 10;
        }
    }

    return start;
}